

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O3

void pq_add(roaring_pq_t *pq,roaring_pq_element_t *t)

{
  ulong uVar1;
  roaring_pq_element_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_pq_element_t *prVar4;
  _Bool _Var5;
  undefined7 uVar6;
  ulong uVar7;
  ulong uVar8;
  
  prVar2 = pq->elements;
  uVar7 = pq->size;
  pq->size = uVar7 + 1;
  prVar2[uVar7].bitmap = t->bitmap;
  _Var5 = t->is_temporary;
  uVar6 = *(undefined7 *)&t->field_0x9;
  prVar2 = prVar2 + uVar7;
  prVar2->size = t->size;
  prVar2->is_temporary = _Var5;
  *(undefined7 *)&prVar2->field_0x9 = uVar6;
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    do {
      uVar1 = uVar7 - 1;
      uVar8 = uVar1 >> 1;
      prVar2 = pq->elements;
      if (prVar2[uVar8].size <= t->size) break;
      prVar2[uVar7].size = prVar2[uVar8].size;
      uVar6 = *(undefined7 *)&prVar2[uVar8].field_0x9;
      prVar3 = prVar2[uVar8].bitmap;
      prVar4 = prVar2 + uVar7;
      prVar4->is_temporary = prVar2[uVar8].is_temporary;
      *(undefined7 *)&prVar4->field_0x9 = uVar6;
      *(roaring_bitmap_t **)(&prVar4->is_temporary + 8) = prVar3;
      uVar7 = uVar8;
    } while (1 < uVar1);
  }
  prVar2 = pq->elements;
  prVar2[uVar7].bitmap = t->bitmap;
  _Var5 = t->is_temporary;
  uVar6 = *(undefined7 *)&t->field_0x9;
  prVar2 = prVar2 + uVar7;
  prVar2->size = t->size;
  prVar2->is_temporary = _Var5;
  *(undefined7 *)&prVar2->field_0x9 = uVar6;
  return;
}

Assistant:

static void pq_add(roaring_pq_t *pq, roaring_pq_element_t *t) {
    uint64_t i = pq->size;
    pq->elements[pq->size++] = *t;
    while (i > 0) {
        uint64_t p = (i - 1) >> 1;
        roaring_pq_element_t ap = pq->elements[p];
        if (!compare(t, &ap)) break;
        pq->elements[i] = ap;
        i = p;
    }
    pq->elements[i] = *t;
}